

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  undefined8 in_RDX;
  undefined4 in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  int Y;
  DateTime x;
  char zBuf [16];
  undefined4 in_stack_ffffffffffffff98;
  int n;
  undefined4 in_stack_ffffffffffffffa8;
  sqlite3_value **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  n = (int)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&stack0xffffffffffffffb8,&DAT_002af550,0x30);
  iVar2 = isDate((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,(DateTime *)in_RDI);
  if (iVar2 == 0) {
    computeYMD((DateTime *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar2 = in_stack_ffffffffffffffc0;
    if (in_stack_ffffffffffffffc0 < 0) {
      iVar2 = -in_stack_ffffffffffffffc0;
    }
    if (in_stack_ffffffffffffffc0 < 0) {
      sqlite3_result_text(in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),n,
                          (_func_void_void_ptr *)CONCAT44(iVar2,in_stack_ffffffffffffff98));
    }
    else {
      sqlite3_result_text(in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),n,
                          (_func_void_void_ptr *)CONCAT44(iVar2,in_stack_ffffffffffffff98));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}